

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecInt.h
# Opt level: O3

int Vec_IntPushUniqueOrderCost(Vec_Int_t *p,int Entry,Vec_Int_t *vCost)

{
  uint uVar1;
  bool bVar2;
  int *piVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  
  uVar1 = p->nSize;
  uVar6 = (ulong)uVar1;
  if (0 < (int)uVar1) {
    piVar3 = p->pArray;
    uVar5 = 0;
    do {
      if (piVar3[uVar5] == Entry) goto LAB_00683b5d;
      uVar5 = uVar5 + 1;
    } while (uVar6 != uVar5);
  }
  if (uVar1 == p->nCap) {
    if ((int)uVar1 < 0x10) {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(0x40);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,0x40);
      }
      p->pArray = piVar3;
      iVar4 = 0x10;
      if (piVar3 == (int *)0x0) {
LAB_00683b88:
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
    }
    else {
      if (p->pArray == (int *)0x0) {
        piVar3 = (int *)malloc(uVar6 * 8);
      }
      else {
        piVar3 = (int *)realloc(p->pArray,uVar6 * 8);
      }
      p->pArray = piVar3;
      if (piVar3 == (int *)0x0) goto LAB_00683b88;
      iVar4 = uVar1 * 2;
    }
    p->nCap = iVar4;
    uVar6 = (ulong)(uint)p->nSize;
  }
  else {
    piVar3 = p->pArray;
  }
  p->nSize = (int)uVar6 + 1;
  if (0 < (int)uVar6) {
    do {
      iVar4 = piVar3[uVar6 - 1];
      if (((((long)iVar4 < 0) || (vCost->nSize <= iVar4)) || (Entry < 0)) ||
         ((uint)vCost->nSize <= (uint)Entry)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      if (vCost->pArray[iVar4] <= vCost->pArray[(uint)Entry]) goto LAB_00683b57;
      piVar3[uVar6] = iVar4;
      bVar2 = 1 < uVar6;
      uVar6 = uVar6 - 1;
    } while (bVar2);
    uVar6 = 0;
  }
LAB_00683b57:
  piVar3[(int)uVar6] = Entry;
LAB_00683b5d:
  return (int)piVar3;
}

Assistant:

static inline int Vec_IntPushUniqueOrderCost( Vec_Int_t * p, int Entry, Vec_Int_t * vCost )
{
    int i;
    for ( i = 0; i < p->nSize; i++ )
        if ( p->pArray[i] == Entry )
            return 1;
    Vec_IntPushOrderCost( p, Entry, vCost );
    return 0;
}